

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O2

void split_tiv_classic(vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_> *gulitems,
                      OASIS_FLOAT tiv)

{
  pointer pgVar1;
  pointer pgVar2;
  pointer pgVar3;
  float fVar4;
  
  fVar4 = 0.0;
  if (0.0 < tiv) {
    pgVar1 = (gulitems->super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pgVar2 = (gulitems->super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (pgVar3 = pgVar2; pgVar3 != pgVar1; pgVar3 = pgVar3 + 1) {
      fVar4 = (float)((double)fVar4 + pgVar3->loss);
    }
    if (tiv < fVar4) {
      for (; pgVar2 != pgVar1; pgVar2 = pgVar2 + 1) {
        pgVar2->loss = (pgVar2->loss / (double)fVar4) * (double)tiv;
      }
    }
  }
  return;
}

Assistant:

void split_tiv_classic(std::vector<gulItemIDLoss> &gulitems, OASIS_FLOAT tiv)
{
// if the total loss exceeds the tiv 
// then split tiv in the same proportions to the losses
	if (tiv > 0) {
		OASIS_FLOAT total_loss = 0;
		auto iter = gulitems.begin();
		while (iter != gulitems.end()) {
			total_loss += iter->loss;
			iter++;
		}
		if (total_loss > tiv) {
			iter = gulitems.begin();
			while (iter != gulitems.end()) {
				double percentage = iter->loss / total_loss;
				iter->loss = percentage * tiv;
				iter++;
			}
		}
	}
}